

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

cali_variant_t cali_channel_get(cali_id_t chn_id,cali_id_t attr_id)

{
  bool bVar1;
  uint64_t uVar2;
  anon_union_8_7_33918203_for_value aVar3;
  cali_variant_t cVar4;
  Channel channel;
  Caliper c;
  undefined1 local_68 [32];
  uint64_t local_48;
  anon_union_8_7_33918203_for_value local_40;
  Caliper local_38;
  
  cali::Caliper::sigsafe_instance();
  cali::Caliper::get_channel((Caliper *)local_68,(cali_id_t)&local_38);
  bVar1 = cali::Caliper::operator_cast_to_bool(&local_38);
  uVar2 = 0;
  aVar3.v_uint = 0;
  if (bVar1) {
    if (((GlobalData *)local_68._8_8_ == (GlobalData *)0x0) ||
       (*(_Atomic_word *)(local_68._8_8_ + 8) < 1)) {
      uVar2 = 0;
      aVar3.v_uint = 0;
    }
    else {
      local_68._16_8_ = cali::Caliper::get_attribute(&local_38,attr_id);
      cali::Caliper::get((Entry *)(local_68 + 0x18),&local_38,(ChannelBody *)local_68._0_8_,
                         (Attribute *)(local_68 + 0x10));
      uVar2 = local_48;
      aVar3 = local_40;
    }
  }
  cali::Channel::~Channel((Channel *)local_68);
  cVar4.value.v_uint = aVar3.v_uint;
  cVar4.type_and_size = uVar2;
  return cVar4;
}

Assistant:

cali_variant_t cali_channel_get(cali_id_t chn_id, cali_id_t attr_id)
{
    Caliper c       = Caliper::sigsafe_instance();
    Channel channel = c.get_channel(chn_id);

    if (!c || !channel)
        return cali_make_empty_variant();

    return c.get(channel.body(), c.get_attribute(attr_id)).value().c_variant();
}